

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void __thiscall
Lib::Exception::Exception<char_const*,std::__cxx11::string,char_const*,unsigned_int,char_const*>
          (Exception *this,char *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_1,char *msg_2,
          uint msg_3,char *msg_4)

{
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)msg_1);
  toString<char_const*,std::__cxx11::string,char_const*,unsigned_int,char_const*>
            (&local_70,this,msg,&local_50,msg_2,msg_3,msg_4);
  Exception(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

explicit Exception(Msg... msg)
   : Exception(toString(msg...))
  { }